

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O2

void spdlog::set_formatter
               (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  _Head_base<0UL,_spdlog::formatter_*,_false> local_10;
  
  details::registry::instance();
  local_10._M_head_impl =
       (formatter->_M_t).
       super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
       super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
       super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (formatter->_M_t).
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  details::registry::set_formatter
            (&details::registry::instance::s_instance,
             (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_10);
  if (local_10._M_head_impl != (formatter *)0x0) {
    (*(local_10._M_head_impl)->_vptr_formatter[1])();
  }
  return;
}

Assistant:

SPDLOG_INLINE void set_formatter(std::unique_ptr<spdlog::formatter> formatter) {
    details::registry::instance().set_formatter(std::move(formatter));
}